

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O0

int __thiscall Fl_File_Icon::load_fti(Fl_File_Icon *this,char *fti)

{
  _func_void_char_ptr_varargs *p_Var1;
  uint uVar2;
  int iVar3;
  Fl_Color c_00;
  float fVar4;
  FILE *__stream;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  short *psVar8;
  double dVar9;
  double dVar10;
  float local_258;
  float local_254;
  float y;
  float x;
  int c_1;
  uint cval;
  int c;
  int outline;
  char *ptr;
  char params [255];
  char command [255];
  int ch;
  FILE *fp;
  char *fti_local;
  Fl_File_Icon *this_local;
  
  __stream = (FILE *)fl_fopen(fti,"rb");
  p_Var1 = Fl::error;
  if (__stream == (FILE *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    (*p_Var1)("Fl_File_Icon::load_fti(): Unable to open \"%s\" - %s",fti,pcVar6);
    this_local._4_4_ = -1;
  }
  else {
    cval = 0;
    do {
      while( true ) {
        do {
          uVar2 = getc(__stream);
          if (uVar2 == 0xffffffff) goto LAB_002778d6;
          iVar3 = isspace(uVar2);
        } while (iVar3 != 0);
        if (uVar2 == 0x23) break;
        iVar3 = isalpha(uVar2);
        p_Var1 = Fl::error;
        if (iVar3 == 0) {
          lVar7 = ftell(__stream);
          (*p_Var1)("Fl_File_Icon::load_fti(): Expected a letter at file position %ld (saw \'%c\')",
                    lVar7 + -1,(ulong)uVar2);
          goto LAB_002778d6;
        }
        params[0xf8] = (char)uVar2;
        _c = (char **)(params + 0xf9);
        while ((uVar2 = getc(__stream), p_Var1 = Fl::error, uVar2 != 0xffffffff && (uVar2 != 0x28)))
        {
          if (_c < command + 0xf6) {
            *(char *)_c = (char)uVar2;
            _c = (char **)((long)_c + 1);
          }
        }
        *(char *)_c = '\0';
        if (uVar2 != 0x28) {
          _c = (char **)((long)_c + 1);
          lVar7 = ftell(__stream);
          (*p_Var1)("Fl_File_Icon::load_fti(): Expected a ( at file position %ld (saw \'%c\')",
                    lVar7 + -1,(ulong)uVar2);
          goto LAB_002778d6;
        }
        _c = &ptr;
        while ((uVar2 = getc(__stream), p_Var1 = Fl::error, uVar2 != 0xffffffff && (uVar2 != 0x29)))
        {
          if (_c < params + 0xf6) {
            *(char *)_c = (char)uVar2;
            _c = (char **)((long)_c + 1);
          }
        }
        *(undefined1 *)_c = 0;
        if (uVar2 != 0x29) {
          _c = (char **)((long)_c + 1);
          lVar7 = ftell(__stream);
          (*p_Var1)("Fl_File_Icon::load_fti(): Expected a ) at file position %ld (saw \'%c\')",
                    lVar7 + -1,(ulong)uVar2);
          goto LAB_002778d6;
        }
        _c = (char **)((long)_c + 1);
        uVar2 = getc(__stream);
        p_Var1 = Fl::error;
        if (uVar2 != 0x3b) {
          lVar7 = ftell(__stream);
          (*p_Var1)("Fl_File_Icon::load_fti(): Expected a ; at file position %ld (saw \'%c\')",
                    lVar7 + -1,(ulong)uVar2);
          goto LAB_002778d6;
        }
        iVar3 = strcmp(params + 0xf8,"color");
        if (iVar3 == 0) {
          iVar3 = strcmp((char *)&ptr,"iconcolor");
          if (iVar3 == 0) {
            add_color(this,0xffffffff);
          }
          else {
            iVar3 = strcmp((char *)&ptr,"shadowcolor");
            if (iVar3 == 0) {
              add_color(this,0x27);
            }
            else {
              iVar3 = strcmp((char *)&ptr,"outlinecolor");
              if (iVar3 == 0) {
                add_color(this,0x38);
              }
              else {
                c_1 = atoi((char *)&ptr);
                if (c_1 < 0) {
                  c_1 = -c_1;
                  c_00 = fl_color_average(c_1 >> 4,c_1 & 0xf,0.5);
                  add_color(this,c_00);
                }
                else {
                  add_color(this,c_1);
                }
              }
            }
          }
        }
        else {
          iVar3 = strcmp(params + 0xf8,"bgnline");
          if (iVar3 == 0) {
            add(this,2);
          }
          else {
            iVar3 = strcmp(params + 0xf8,"bgnclosedline");
            if (iVar3 == 0) {
              add(this,3);
            }
            else {
              iVar3 = strcmp(params + 0xf8,"bgnpolygon");
              if (iVar3 == 0) {
                add(this,4);
              }
              else {
                iVar3 = strcmp(params + 0xf8,"bgnoutlinepolygon");
                if (iVar3 == 0) {
                  add(this,5);
                  psVar8 = add(this,0);
                  cval = (uint)((long)psVar8 - (long)this->data_ >> 1);
                  add(this,0);
                }
                else {
                  iVar3 = strcmp(params + 0xf8,"endoutlinepolygon");
                  if ((iVar3 == 0) && (cval != 0)) {
                    iVar3 = strcmp((char *)&ptr,"iconcolor");
                    if (iVar3 == 0) {
                      x = -NAN;
                      fVar4 = x;
                    }
                    else {
                      iVar3 = strcmp((char *)&ptr,"shadowcolor");
                      if (iVar3 == 0) {
                        x = 5.46506e-44;
                        fVar4 = x;
                      }
                      else {
                        iVar3 = strcmp((char *)&ptr,"outlinecolor");
                        if (iVar3 == 0) {
                          x = 7.84727e-44;
                          fVar4 = x;
                        }
                        else {
                          y = (float)atoi((char *)&ptr);
                          fVar4 = y;
                          if ((int)y < 0) {
                            y = (float)-(int)y;
                            fVar4 = (float)fl_color_average((int)y >> 4,(uint)y & 0xf,0.5);
                          }
                        }
                      }
                    }
                    x = fVar4;
                    this->data_[(int)cval] = (short)((uint)x >> 0x10);
                    this->data_[(int)(cval + 1)] = SUB42(x,0);
                    cval = 0;
                    add(this,0);
                  }
                  else {
                    iVar3 = strncmp(params + 0xf8,"end",3);
                    if (iVar3 == 0) {
                      add(this,0);
                    }
                    else {
                      iVar3 = strcmp(params + 0xf8,"vertex");
                      p_Var1 = Fl::error;
                      if (iVar3 != 0) {
                        lVar7 = ftell(__stream);
                        (*p_Var1)("Fl_File_Icon::load_fti(): Unknown command \"%s\" at file position %ld."
                                  ,params + 0xf8,lVar7 + -1);
                        goto LAB_002778d6;
                      }
                      iVar3 = __isoc99_sscanf(&ptr,"%f,%f",&local_254,&local_258);
                      if (iVar3 != 2) goto LAB_002778d6;
                      dVar9 = rint((double)local_254 * 100.0);
                      dVar10 = rint((double)local_258 * 100.0);
                      add_vertex(this,(int)(short)(int)dVar9,(int)(short)(int)dVar10);
                    }
                  }
                }
              }
            }
          }
        }
      }
      do {
        iVar3 = getc(__stream);
        if (iVar3 == -1) break;
      } while (iVar3 != 10);
    } while (iVar3 != -1);
LAB_002778d6:
    fclose(__stream);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int					// O - 0 on success, non-zero on error
Fl_File_Icon::load_fti(const char *fti)	// I - File to read from
{
  FILE	*fp;			// File pointer
  int	ch;			// Current character
  char	command[255],		// Command string ("vertex", etc.)
	params[255],		// Parameter string ("10.0,20.0", etc.)
	*ptr;			// Pointer into strings
  int	outline;		// Outline polygon


  // Try to open the file...
  if ((fp = fl_fopen(fti, "rb")) == NULL)
  {
    Fl::error("Fl_File_Icon::load_fti(): Unable to open \"%s\" - %s",
              fti, strerror(errno));
    return -1;
  }

  // Read the entire file, adding data as needed...
  outline = 0;

  while ((ch = getc(fp)) != EOF)
  {
    // Skip whitespace
    if (isspace(ch))
      continue;

    // Skip comments starting with "#"...
    if (ch == '#')
    {
      while ((ch = getc(fp)) != EOF)
        if (ch == '\n')
	  break;

      if (ch == EOF)
        break;
      else
        continue;
    }

    // OK, this character better be a letter...
    if (!isalpha(ch))
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a letter at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Scan the command name...
    ptr    = command;
    *ptr++ = ch;

    while ((ch = getc(fp)) != EOF)
    {
      if (ch == '(')
        break;
      else if (ptr < (command + sizeof(command) - 1))
        *ptr++ = ch;
    }

    *ptr++ = '\0';

    // Make sure we stopped on a parenthesis...
    if (ch != '(')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ( at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Scan the parameters...
    ptr = params;

    while ((ch = getc(fp)) != EOF)
    {
      if (ch == ')')
        break;
      else if (ptr < (params + sizeof(params) - 1))
        *ptr++ = ch;
    }

    *ptr++ = '\0';

    // Make sure we stopped on a parenthesis...
    if (ch != ')')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ) at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Make sure the next character is a semicolon...
    if ((ch = getc(fp)) != ';')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ; at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Now process the command...
    if (strcmp(command, "color") == 0)
    {
      // Set the color; for negative colors blend the two primaries to
      // produce a composite color.  Also, the following symbolic color
      // names are understood:
      //
      //     name           FLTK color
      //     -------------  ----------
      //     iconcolor      FL_ICON_COLOR; mapped to the icon color in
      //                    Fl_File_Icon::draw()
      //     shadowcolor    FL_DARK3
      //     outlinecolor   FL_BLACK
      if (strcmp(params, "iconcolor") == 0)
        add_color(FL_ICON_COLOR);
      else if (strcmp(params, "shadowcolor") == 0)
        add_color(FL_DARK3);
      else if (strcmp(params, "outlinecolor") == 0)
        add_color(FL_BLACK);
      else
      {
        int c = atoi(params);	// Color value


        if (c < 0)
	{
	  // Composite color; compute average...
	  c = -c;
	  add_color(fl_color_average((Fl_Color)(c >> 4),
	                             (Fl_Color)(c & 15), 0.5f));
	}
	else
	  add_color((Fl_Color)c);
      }
    }
    else if (strcmp(command, "bgnline") == 0)
      add(LINE);
    else if (strcmp(command, "bgnclosedline") == 0)
      add(CLOSEDLINE);
    else if (strcmp(command, "bgnpolygon") == 0)
      add(POLYGON);
    else if (strcmp(command, "bgnoutlinepolygon") == 0)
    {
      add(OUTLINEPOLYGON);
      outline = add(0) - data_;
      add(0);
    }
    else if (strcmp(command, "endoutlinepolygon") == 0 && outline)
    {
      unsigned cval; // Color value

      // Set the outline color; see above for valid values...
      if (strcmp(params, "iconcolor") == 0)
        cval = FL_ICON_COLOR;
      else if (strcmp(params, "shadowcolor") == 0)
        cval = FL_DARK3;
      else if (strcmp(params, "outlinecolor") == 0)
        cval = FL_BLACK;
      else
      {
        int c = atoi(params);	// Color value


        if (c < 0)
	{
	  // Composite color; compute average...
	  c = -c;
	  cval = fl_color_average((Fl_Color)(c >> 4), (Fl_Color)(c & 15), 0.5f);
	}
	else
	  cval = c;
      }

      // Store outline color...
      data_[outline]     = cval >> 16;
      data_[outline + 1] = cval;

      outline = 0;
      add(END);
    }
    else if (strncmp(command, "end", 3) == 0)
      add(END);
    else if (strcmp(command, "vertex") == 0)
    {
      float x, y;		// Coordinates of vertex


      if (sscanf(params, "%f,%f", &x, &y) != 2)
        break;

      add_vertex((short)(int)rint(x * 100.0), (short)(int)rint(y * 100.0));
    }
    else
    {
      Fl::error("Fl_File_Icon::load_fti(): Unknown command \"%s\" at file position %ld.",
                command, ftell(fp) - 1);
      break;
    }
  }

  // Close the file and return...
  fclose(fp);

#ifdef DEBUG
  printf("Icon File \"%s\":\n", fti);
  for (int i = 0; i < num_data_; i ++)
    printf("    %d,\n", data_[i]);
#endif /* DEBUG */

  return 0;
}